

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O1

DP_WS_Stream
MpiInitWriter(CP_Services Svcs,void *CP_Stream,_SstParams *Params,attr_list DPAttrs,SstStats Stats)

{
  uint uVar1;
  undefined8 *puVar2;
  CManager p_Var3;
  SMPI_Comm comm;
  ulong uVar4;
  undefined8 uVar5;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_34;
  
  puVar2 = (undefined8 *)calloc(0xa0,1);
  p_Var3 = (*Svcs->getCManager)(CP_Stream);
  comm = (*Svcs->getMPIComm)(CP_Stream);
  pthread_mutexattr_init(&local_34);
  pthread_mutexattr_settype(&local_34,1);
  pthread_mutex_init((pthread_mutex_t *)(puVar2 + 0xf),&local_34);
  pthread_rwlock_init((pthread_rwlock_t *)(puVar2 + 8),(pthread_rwlockattr_t *)0x0);
  SMPI_Comm_rank(comm,(int *)(puVar2 + 1));
  *puVar2 = CP_Stream;
  uVar1 = getpid();
  uVar4 = gethostid();
  puVar2[2] = uVar4 & 0xffffffff | (ulong)uVar1 << 0x20;
  puVar2[4] = 0;
  puVar2[5] = puVar2 + 4;
  puVar2[6] = 0;
  puVar2[7] = puVar2 + 6;
  uVar5 = CMregister_format(p_Var3,MpiReadRequestStructs);
  CMregister_handler(uVar5,MpiReadRequestHandler,Svcs);
  uVar5 = CMregister_format(p_Var3,MpiReadReplyStructs);
  puVar2[3] = uVar5;
  (*Svcs->verbose)(CP_Stream,5,"MpiInitWriter initialized addr=%p\n",puVar2);
  return puVar2;
}

Assistant:

static DP_WS_Stream MpiInitWriter(CP_Services Svcs, void *CP_Stream, struct _SstParams *Params,
                                  attr_list DPAttrs, SstStats Stats)
{
    MpiStreamWR Stream = calloc(sizeof(struct _MpiStreamWR), 1);
    CManager cm = Svcs->getCManager(CP_Stream);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    /* Make MutexReaders to be recursive */
    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&Stream->MutexReaders, &attr);

    pthread_rwlock_init(&Stream->LockTS, NULL);

    SMPI_Comm_rank(comm, &Stream->Stream.Rank);

    Stream->Stream.CP_Stream = CP_Stream;
    Stream->Stream.taskID = GetUniqueTaskId();
    STAILQ_INIT(&Stream->TimeSteps);
    TAILQ_INIT(&Stream->Readers);

    /* * add a handler for read request messages */
    F = CMregister_format(cm, MpiReadRequestStructs);
    CMregister_handler(F, MpiReadRequestHandler, Svcs);

    /* * register read reply message structure so we can send later */
    Stream->ReadReplyFormat = CMregister_format(cm, MpiReadReplyStructs);

    Svcs->verbose(CP_Stream, DPTraceVerbose, "MpiInitWriter initialized addr=%p\n", Stream);

    return (void *)Stream;
}